

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement(IfcReinforcingElement *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x92df00;
  *(undefined8 *)&this->field_0x190 = 0x92e040;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x92df28;
  (this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x92df50;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x92df78;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x92dfa0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.field_0x138
       = 0x92dfc8;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.field_0x148
       = 0x92dff0;
  *(undefined8 *)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158 =
       0x92e018;
  puVar1 = *(undefined1 **)&(this->super_IfcBuildingElementComponent).field_0x168;
  if (puVar1 != &this->field_0x178) {
    operator_delete(puVar1,*(long *)&this->field_0x178 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0092e068);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}